

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastMultiplier3
               (Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes,
               int fSigned,int fCla)

{
  int iVar1;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  ulong uVar2;
  int nSize;
  ulong uVar3;
  ulong uVar4;
  int Level;
  ulong uVar5;
  
  nSize = nArgB + nArgA;
  p = Vec_WecStart(nSize);
  p_00 = Vec_WecStart(nSize);
  uVar3 = 0;
  uVar5 = (ulong)(uint)nArgB;
  if (nArgB < 1) {
    uVar5 = uVar3;
  }
  uVar2 = 0;
  if (0 < nArgA) {
    uVar2 = (ulong)(uint)nArgA;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar1 = Gia_ManHashAnd(pNew,pArgA[uVar3],pArgB[uVar4]);
      iVar1 = Abc_LitNotCond(iVar1,(uint)((nArgB - 1 == uVar4) != (uVar3 == nArgA - 1) &&
                                         fSigned != 0));
      Level = (int)uVar4 + (int)uVar3;
      Vec_WecPush(p,Level,iVar1);
      Vec_WecPush(p_00,Level,0);
    }
  }
  if (fSigned != 0) {
    Vec_WecPush(p,nArgA,1);
    Vec_WecPush(p_00,nArgA,0);
    Vec_WecPush(p,nSize + -1,1);
    Vec_WecPush(p_00,nSize + -1,0);
  }
  Wlc_BlastReduceMatrix(pNew,p,p_00,vRes,fSigned,fCla);
  Vec_WecFree(p);
  Vec_WecFree(p_00);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            int fCompl = fSigned && ((i == nArgA-1) ^ (k == nArgB-1));
            Vec_WecPush( vProds,  i+k, Abc_LitNotCond(Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]), fCompl) );
            Vec_WecPush( vLevels, i+k, 0 );
        }
    if ( fSigned )
    {
        Vec_WecPush( vProds,  nArgA, 1 );
        Vec_WecPush( vLevels, nArgA, 0 );

        Vec_WecPush( vProds,  nArgA+nArgB-1, 1 );
        Vec_WecPush( vLevels, nArgA+nArgB-1, 0 );
    }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, fSigned, fCla );
//    Wlc_BlastReduceMatrix2( pNew, vProds, vRes, fSigned, fCla );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}